

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::Test::HasSameFixtureClass(void)

{
  TestInfo *pTVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  UnitTestImpl *pUVar4;
  Message *pMVar5;
  pointer *__ptr;
  AssertHelper local_58;
  char *TEST_name;
  AssertHelper local_48;
  char *TEST_F_name;
  char *this_test_name;
  char *first_test_name;
  pointer local_28;
  
  pUVar4 = internal::GetUnitTestImpl();
  pTVar1 = *(pUVar4->current_test_suite_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = (undefined1 *)pTVar1->fixture_class_id_;
  first_test_name = (pTVar1->name_)._M_dataplus._M_p;
  pTVar1 = pUVar4->current_test_info_;
  puVar3 = (undefined1 *)pTVar1->fixture_class_id_;
  this_test_name = (pTVar1->name_)._M_dataplus._M_p;
  if (puVar3 != puVar2) {
    if ((puVar2 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      TEST_F_name = first_test_name;
      TEST_name = this_test_name;
      if (puVar2 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        TEST_F_name = this_test_name;
        TEST_name = first_test_name;
      }
      Message::Message((Message *)&local_58);
      std::operator<<((ostream *)&(local_58.data_)->line,
                      "All tests in the same test suite must use the same test fixture\n");
      std::operator<<((ostream *)&(local_58.data_)->line,
                      "class, so mixing TEST_F and TEST in the same test suite is\n");
      std::operator<<((ostream *)&(local_58.data_)->line,"illegal.  In test suite ");
      local_28 = (pTVar1->test_suite_name_)._M_dataplus._M_p;
      pMVar5 = Message::operator<<((Message *)&local_58,&local_28);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [3])0x420ac7);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [6])0x42023b);
      pMVar5 = Message::operator<<(pMVar5,&TEST_F_name);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [30])" is defined using TEST_F but\n");
      pMVar5 = Message::operator<<(pMVar5,(char (*) [6])0x42023b);
      pMVar5 = Message::operator<<(pMVar5,&TEST_name);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [39])" is defined using TEST.  You probably\n");
      pMVar5 = Message::operator<<(pMVar5,(char (*) [62])
                                          "want to change the TEST to TEST_F or move it to another test\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [6])"case.");
      internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/src/gtest.cc"
                 ,0x9c2,"Failed");
      internal::AssertHelper::operator=(&local_48,pMVar5);
      internal::AssertHelper::~AssertHelper(&local_48);
    }
    else {
      Message::Message((Message *)&TEST_name);
      std::operator<<((ostream *)(TEST_name + 0x10),
                      "All tests in the same test suite must use the same test fixture\n");
      std::operator<<((ostream *)(TEST_name + 0x10),"class.  However, in test suite ");
      TEST_F_name = (pTVar1->test_suite_name_)._M_dataplus._M_p;
      pMVar5 = Message::operator<<((Message *)&TEST_name,&TEST_F_name);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [3])0x420ac7);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [18])"you defined test ");
      pMVar5 = Message::operator<<(pMVar5,&first_test_name);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [11])" and test ");
      pMVar5 = Message::operator<<(pMVar5,&this_test_name);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [2])0x4206da);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [63])
                                          "using two different test fixture classes.  This can happen if\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [62])
                                          "the two classes are from different namespaces or translation\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [63])
                                          "units and have the same name.  You should probably rename one\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [60])
                                          "of the classes to put the tests into different test suites."
                                  );
      internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/src/gtest.cc"
                 ,0x9ce,"Failed");
      internal::AssertHelper::operator=(&local_58,pMVar5);
      internal::AssertHelper::~AssertHelper(&local_58);
      local_58.data_ = (AssertHelperData *)TEST_name;
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  return puVar3 == puVar2;
}

Assistant:

bool Test::HasSameFixtureClass() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  const TestSuite* const test_suite = impl->current_test_suite();

  // Info about the first test in the current test suite.
  const TestInfo* const first_test_info = test_suite->test_info_list()[0];
  const internal::TypeId first_fixture_id = first_test_info->fixture_class_id_;
  const char* const first_test_name = first_test_info->name();

  // Info about the current test.
  const TestInfo* const this_test_info = impl->current_test_info();
  const internal::TypeId this_fixture_id = this_test_info->fixture_class_id_;
  const char* const this_test_name = this_test_info->name();

  if (this_fixture_id != first_fixture_id) {
    // Is the first test defined using TEST?
    const bool first_is_TEST = first_fixture_id == internal::GetTestTypeId();
    // Is this test defined using TEST?
    const bool this_is_TEST = this_fixture_id == internal::GetTestTypeId();

    if (first_is_TEST || this_is_TEST) {
      // Both TEST and TEST_F appear in same test suite, which is incorrect.
      // Tell the user how to fix this.

      // Gets the name of the TEST and the name of the TEST_F.  Note
      // that first_is_TEST and this_is_TEST cannot both be true, as
      // the fixture IDs are different for the two tests.
      const char* const TEST_name =
          first_is_TEST ? first_test_name : this_test_name;
      const char* const TEST_F_name =
          first_is_TEST ? this_test_name : first_test_name;

      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class, so mixing TEST_F and TEST in the same test suite is\n"
          << "illegal.  In test suite " << this_test_info->test_suite_name()
          << ",\n"
          << "test " << TEST_F_name << " is defined using TEST_F but\n"
          << "test " << TEST_name << " is defined using TEST.  You probably\n"
          << "want to change the TEST to TEST_F or move it to another test\n"
          << "case.";
    } else {
      // Two fixture classes with the same name appear in two different
      // namespaces, which is not allowed. Tell the user how to fix this.
      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class.  However, in test suite "
          << this_test_info->test_suite_name() << ",\n"
          << "you defined test " << first_test_name << " and test "
          << this_test_name << "\n"
          << "using two different test fixture classes.  This can happen if\n"
          << "the two classes are from different namespaces or translation\n"
          << "units and have the same name.  You should probably rename one\n"
          << "of the classes to put the tests into different test suites.";
    }
    return false;
  }

  return true;
}